

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::DiffuseTransmissionMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,DiffuseTransmissionMaterial *this,
          SampledWavelengths *param_3,float *param_4,undefined8 param_5,undefined8 param_6,
          undefined8 param_7,ulong param_8,undefined8 param_9,undefined8 param_10,
          undefined8 param_11,undefined8 param_12,undefined8 param_13,undefined8 param_14)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  BSDF *pBVar7;
  Float FVar8;
  undefined1 auVar15 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined8 in_XMM1_Qb;
  SampledSpectrum SVar16;
  UniversalTextureEvaluator local_f9;
  BSDF *local_f8;
  BxDFHandle local_f0;
  uintptr_t local_e8;
  uintptr_t local_e0;
  uintptr_t local_d8;
  SampledSpectrum t;
  SampledSpectrum r;
  DiffuseBxDF local_b0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  SampledSpectrum local_40;
  
  FVar8 = this->scale;
  local_d8 = (this->reflectance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_68 = *(undefined8 *)(param_3->lambda).values;
  uStack_60 = *(undefined8 *)((param_3->lambda).values + 2);
  uStack_58 = *(undefined8 *)(param_3->pdf).values;
  uStack_50 = *(undefined8 *)((param_3->pdf).values + 2);
  auVar15 = ZEXT856(param_8);
  ctx._8_8_ = param_8;
  ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx._32_8_ = param_11;
  ctx._40_8_ = param_12;
  ctx._48_8_ = param_13;
  ctx._56_8_ = param_14;
  local_f8 = __return_storage_ptr__;
  SVar16 = UniversalTextureEvaluator::operator()
                     (&local_f9,(SpectrumTextureHandle)&local_d8,ctx,*param_3);
  auVar9._0_8_ = SVar16.values.values._0_8_;
  auVar9._8_56_ = auVar15;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = SVar16.values.values._8_8_;
  t.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar1);
  auVar15 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*(&t,FVar8);
  auVar10._0_8_ = SVar16.values.values._0_8_;
  auVar10._8_56_ = auVar15;
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = SVar16.values.values._8_8_;
  local_b0.R.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar2);
  auVar15 = ZEXT856(local_b0.R.values.values._8_8_);
  SVar16 = Clamp<int,int>(&local_b0.R,0,1);
  auVar11._0_8_ = SVar16.values.values._0_8_;
  auVar11._8_56_ = auVar15;
  auVar3._8_8_ = in_XMM1_Qb;
  auVar3._0_8_ = SVar16.values.values._8_8_;
  r.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar3);
  FVar8 = this->scale;
  local_e0 = (this->transmittance).
             super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             .bits;
  local_88 = *(undefined8 *)(param_3->lambda).values;
  uStack_80 = *(undefined8 *)((param_3->lambda).values + 2);
  uStack_78 = *(undefined8 *)(param_3->pdf).values;
  uStack_70 = *(undefined8 *)((param_3->pdf).values + 2);
  auVar15 = ZEXT856(param_8);
  ctx_00._8_8_ = param_8;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_00._32_8_ = param_11;
  ctx_00._40_8_ = param_12;
  ctx_00._48_8_ = param_13;
  ctx_00._56_8_ = param_14;
  SVar16 = UniversalTextureEvaluator::operator()
                     (&local_f9,(SpectrumTextureHandle)&local_e0,ctx_00,*param_3);
  auVar12._0_8_ = SVar16.values.values._0_8_;
  auVar12._8_56_ = auVar15;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = SVar16.values.values._8_8_;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar4);
  auVar15 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*(&local_40,FVar8);
  auVar13._0_8_ = SVar16.values.values._0_8_;
  auVar13._8_56_ = auVar15;
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = SVar16.values.values._8_8_;
  local_b0.R.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar5);
  auVar15 = ZEXT856(local_b0.R.values.values._8_8_);
  SVar16 = Clamp<int,int>(&local_b0.R,0,1);
  auVar14._0_8_ = SVar16.values.values._0_8_;
  auVar14._8_56_ = auVar15;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = SVar16.values.values._8_8_;
  t.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar6);
  local_e8 = (this->sigma).
             super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
             .bits;
  ctx_01._8_8_ = param_8;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_7;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>._4_8_ = param_9;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>._0_8_ = param_10;
  ctx_01._32_8_ = param_11;
  ctx_01._40_8_ = param_12;
  ctx_01._48_8_ = param_13;
  ctx_01._56_8_ = param_14;
  FVar8 = UniversalTextureEvaluator::operator()(&local_f9,(FloatTextureHandle)&local_e8,ctx_01);
  DiffuseBxDF::DiffuseBxDF(&local_b0,&r,&t,FVar8);
  pBVar7 = local_f8;
  param_4[8] = local_b0.A;
  param_4[9] = local_b0.B;
  *(undefined8 *)param_4 = local_b0.R.values.values._0_8_;
  *(undefined8 *)(param_4 + 2) = local_b0.R.values.values._8_8_;
  *(undefined8 *)(param_4 + 4) = local_b0.T.values.values._0_8_;
  *(undefined8 *)(param_4 + 6) = local_b0.T.values.values._8_8_;
  local_f0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_4 | 0x2000000000000);
  BSDF::BSDF(local_f8,(Vector3f *)&stack0x00000048,(Normal3f *)&stack0x00000054,
             (Normal3f *)&stack0x00000060,(Vector3f *)&stack0x0000006c,&local_f0,1.0);
  return pBVar7;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda, DiffuseBxDF *bxdf) const {
        SampledSpectrum r = Clamp(scale * texEval(reflectance, ctx, lambda), 0, 1);
        SampledSpectrum t = Clamp(scale * texEval(transmittance, ctx, lambda), 0, 1);
        Float s = texEval(sigma, ctx);
        *bxdf = DiffuseBxDF(r, t, s);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }